

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void f_parser(lua_State *L,void *ud)

{
  size_t sVar1;
  ZIO *z;
  char *__s;
  byte *pbVar2;
  global_State *pgVar3;
  size_t l;
  void *pvVar4;
  GCObject *pGVar5;
  GCObject *pGVar6;
  StkId pTVar7;
  ulong uVar8;
  LexState lexstate;
  FuncState local_280;
  
  if (L->l_G->GCthreshold <= L->l_G->totalbytes) {
    luaC_step(L);
  }
  z = *ud;
  __s = *(char **)((long)ud + 0x20);
  lexstate.buff = (Mbuffer *)((long)ud + 8);
  l = strlen(__s);
  lexstate.source = luaS_newlstr(L,__s,l);
  lexstate.decpoint = '.';
  lexstate.lookahead.token = 0x11f;
  lexstate.fs = (FuncState *)0x0;
  lexstate.linenumber = 1;
  lexstate.lastline = 1;
  lexstate.L = L;
  lexstate.z = z;
  pvVar4 = luaM_realloc_(L,*(void **)((long)ud + 8),*(size_t *)((long)ud + 0x18),0x20);
  *(void **)((long)ud + 8) = pvVar4;
  *(undefined8 *)((long)ud + 0x18) = 0x20;
  sVar1 = z->n;
  z->n = z->n - 1;
  if (sVar1 == 0) {
    lexstate.current = luaZ_fill(z);
  }
  else {
    pbVar2 = (byte *)z->p;
    z->p = (char *)(pbVar2 + 1);
    lexstate.current = (int)*pbVar2;
  }
  open_func(&lexstate,&local_280);
  *(lu_byte *)((long)&(local_280.f)->nups + 2) = '\x02';
  luaX_next(&lexstate);
  chunk(&lexstate);
  check(&lexstate,0x11f);
  close_func(&lexstate);
  pGVar5 = (GCObject *)
           luaF_newLclosure(L,(uint)(byte)*(lu_mem *)&(local_280.f)->nups,&((L->l_gt).value.gc)->h);
  (pGVar5->th).l_G = (global_State *)local_280.f;
  for (uVar8 = 0; uVar8 < (byte)*(lu_mem *)&(local_280.f)->nups; uVar8 = uVar8 + 1) {
    pGVar6 = (GCObject *)luaM_realloc_(L,(void *)0x0,0,0x28);
    pgVar3 = L->l_G;
    (pGVar6->gch).next = pgVar3->rootgc;
    pgVar3->rootgc = pGVar6;
    (pGVar6->gch).marked = pgVar3->currentwhite & 3;
    (pGVar6->gch).tt = '\n';
    (pGVar6->h).metatable = (Table *)&(pGVar6->h).array;
    *(undefined4 *)&(pGVar6->h).node = 0;
    *(GCObject **)((long)pGVar5 + uVar8 * 8 + 0x28) = pGVar6;
  }
  pTVar7 = L->top;
  (pTVar7->value).gc = pGVar5;
  pTVar7->tt = 6;
  pTVar7 = L->top;
  if ((long)L->stack_last - (long)pTVar7 < 0x11) {
    luaD_growstack(L,1);
    pTVar7 = L->top;
  }
  L->top = pTVar7 + 1;
  return;
}

Assistant:

static void f_parser(lua_State*L,void*ud){
int i;
Proto*tf;
Closure*cl;
struct SParser*p=cast(struct SParser*,ud);
luaC_checkGC(L);
tf=luaY_parser(L,p->z,
&p->buff,p->name);
cl=luaF_newLclosure(L,tf->nups,hvalue(gt(L)));
cl->l.p=tf;
for(i=0;i<tf->nups;i++)
cl->l.upvals[i]=luaF_newupval(L);
setclvalue(L,L->top,cl);
incr_top(L);
}